

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  uint uVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *pxVar4;
  __int32_t **pp_Var5;
  long lVar6;
  byte bVar7;
  int error;
  uint val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    error = 0xc;
    goto LAB_001dc8d8;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001dc8d8;
  }
  if (ctxt->value == (xmlXPathObjectPtr)0x0) {
LAB_001dc8d0:
    error = 0xb;
LAB_001dc8d8:
    xmlXPathErr(ctxt,error);
    return;
  }
  if (ctxt->value->type != XPATH_STRING) {
    xmlXPathStringFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
    goto LAB_001dc8d0;
  }
  pxVar3 = valuePop(ctxt);
  pbVar1 = pxVar3->stringval;
  pxVar4 = xmlNodeGetLang(ctxt->context->node);
  if (pbVar1 == (byte *)0x0 || pxVar4 == (xmlChar *)0x0) {
    val = 0;
    uVar2 = 0;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_001dc917;
  }
  else {
    bVar7 = *pbVar1;
    if (bVar7 == 0) {
      lVar6 = 0;
    }
    else {
      pp_Var5 = __ctype_toupper_loc();
      lVar6 = 0;
      do {
        uVar2 = 0;
        if ((*pp_Var5)[bVar7] != (*pp_Var5)[pxVar4[lVar6]]) goto LAB_001dc90b;
        bVar7 = pbVar1[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (bVar7 != 0);
    }
    uVar2 = (uint)(pxVar4[lVar6] == '-' || pxVar4[lVar6] == '\0');
  }
LAB_001dc90b:
  val = uVar2;
  (*xmlFree)(pxVar4);
LAB_001dc917:
  xmlXPathReleaseObject(ctxt->context,pxVar3);
  pxVar3 = xmlXPathCacheNewBoolean(ctxt->context,val);
  valuePush(ctxt,pxVar3);
  return;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val = NULL;
    const xmlChar *theLang = NULL;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = valuePop(ctxt);
    lang = val->stringval;
    theLang = xmlNodeGetLang(ctxt->context->node);
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
	    if (toupper(lang[i]) != toupper(theLang[i]))
	        goto not_equal;
	if ((theLang[i] == 0) || (theLang[i] == '-'))
	    ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, ret));
}